

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

int walk_directory(CPUMIPSState_conflict2 *env,uint64_t *vaddr,int directory_index,_Bool *huge_page,
                  _Bool *hgpg_directory_hit,uint64_t *pw_entrylo0,uint64_t *pw_entrylo1)

{
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong *puVar5;
  sbyte sVar6;
  ulong vaddr_00;
  uint uVar7;
  uint access_type;
  ulong uVar8;
  byte bVar9;
  int prot;
  uint64_t paddr;
  int in_stack_ffffffffffffff78;
  ulong local_78;
  ulong *local_70;
  ulong local_68;
  uint local_5c;
  uint local_58;
  int local_54;
  ulong local_50;
  _Bool *local_48;
  _Bool *local_40;
  hwaddr local_38;
  
  local_68 = (ulong)(uint)env->CP0_PWCtl;
  uVar2 = env->CP0_PWSize & 0x3f;
  iVar3 = ((env->CP0_PWSize >> 0x1e & 1) != 0) + 2;
  sVar6 = 2;
  bVar9 = (byte)((uint)env->CP0_PWCtl >> 6);
  if (uVar2 < 2) {
    sVar6 = (uVar2 == 1 & bVar9) + (char)iVar3 + 3;
  }
  uVar8 = 0xffffffff;
  if (uVar2 < 2) {
    uVar8 = (ulong)(iVar3 + (uint)(uVar2 == 1));
  }
  local_50 = (ulong)env->CP0_PWField;
  uVar2 = 3;
  if ((env->hflags >> 0x1c & 1) == 0) {
    uVar2 = env->hflags & 3;
  }
  local_70 = pw_entrylo0;
  local_58 = directory_index;
  local_48 = huge_page;
  local_40 = hgpg_directory_hit;
  iVar3 = get_physical_address
                    (env,&local_38,&local_54,(target_ulong_conflict)*vaddr,0,uVar2,
                     in_stack_ffffffffffffff78);
  if ((iVar3 == 0) &&
     (local_5c = 1 << ((byte)uVar8 + 3 & 0x1f), _Var1 = get_pte(env,*vaddr,1 << sVar6,&local_78),
     uVar2 = local_5c, _Var1)) {
    if ((bVar9 & (local_78 >> ((uint)local_68 & 0x3f) & 1) != 0) != 1) {
      *vaddr = local_78;
      return 2;
    }
    uVar4 = (uint)local_50 & 0x3f;
    uVar7 = uVar4 - 0x20;
    if (uVar4 <= local_5c) {
      uVar7 = uVar4;
    }
    local_78 = local_78 >> ((byte)(uVar7 - 2) & 0x3f);
    *local_48 = true;
    *local_40 = true;
    local_78 = (ulong)(uint)((int)local_78 << 0x1e) | local_78 >> 2;
    if ((local_58 & 1) != 0) {
      uVar8 = (ulong)((uint)(1 << ((char)local_58 - 1U & 0x1f)) >> 6);
      *local_70 = ~uVar8 & local_78;
      *pw_entrylo1 = local_78 | uVar8;
      return 1;
    }
    if (-1 < (char)local_68) {
      return 0;
    }
    uVar4 = 1 << ((byte)uVar8 & 0x1f);
    vaddr_00 = *vaddr ^ (ulong)uVar4;
    puVar5 = pw_entrylo1;
    if ((*vaddr >> (uVar8 & 0x3f) & 1) == 0) {
      puVar5 = local_70;
    }
    *puVar5 = local_78;
    access_type = 3;
    if ((env->hflags >> 0x1c & 1) == 0) {
      access_type = env->hflags & 3;
    }
    local_68 = (ulong)(uVar7 - 2);
    iVar3 = get_physical_address
                      (env,&local_38,&local_54,(target_ulong_conflict)vaddr_00,0,access_type,
                       in_stack_ffffffffffffff78);
    if (iVar3 == 0) {
      _Var1 = get_pte(env,vaddr_00,uVar2,&local_78);
      if (!_Var1) {
        return 0;
      }
      local_78 = local_78 >> ((byte)local_68 & 0x3f);
      uVar8 = (ulong)(uint)((int)local_78 << 0x1e) | local_78 >> 2;
      if (((uint)*vaddr & uVar4) == 0) {
        *pw_entrylo1 = uVar8;
      }
      else {
        *local_70 = uVar8;
      }
      return 1;
    }
  }
  return 0;
}

Assistant:

static int walk_directory(CPUMIPSState *env, uint64_t *vaddr,
        int directory_index, bool *huge_page, bool *hgpg_directory_hit,
        uint64_t *pw_entrylo0, uint64_t *pw_entrylo1)
{
    int dph = (env->CP0_PWCtl >> CP0PC_DPH) & 0x1;
    int psn = (env->CP0_PWCtl >> CP0PC_PSN) & 0x3F;
    int hugepg = (env->CP0_PWCtl >> CP0PC_HUGEPG) & 0x1;
    int pf_ptew = (env->CP0_PWField >> CP0PF_PTEW) & 0x3F;
    int ptew = (env->CP0_PWSize >> CP0PS_PTEW) & 0x3F;
    int native_shift = (((env->CP0_PWSize >> CP0PS_PS) & 1) == 0) ? 2 : 3;
    int directory_shift = (ptew > 1) ? -1 :
            (hugepg && (ptew == 1)) ? native_shift + 1 : native_shift;
    int leaf_shift = (ptew > 1) ? -1 :
            (ptew == 1) ? native_shift + 1 : native_shift;
    uint32_t direntry_size = 1 << (directory_shift + 3);
    uint32_t leafentry_size = 1 << (leaf_shift + 3);
    uint64_t entry;
    uint64_t paddr;
    int prot;
    uint64_t lsb = 0;
    uint64_t w = 0;

    if (get_physical_address(env, &paddr, &prot, *vaddr, MMU_DATA_LOAD,
                             ACCESS_INT, cpu_mmu_index(env, false)) !=
                             TLBRET_MATCH) {
        /* wrong base address */
        return 0;
    }
    if (!get_pte(env, *vaddr, direntry_size, &entry)) {
        return 0;
    }

    if ((entry & (1ULL << psn)) && hugepg) {
        *huge_page = true;
        *hgpg_directory_hit = true;
        entry = get_tlb_entry_layout(env, entry, leafentry_size, pf_ptew);
        w = directory_index - 1;
        if (directory_index & 0x1) {
            /* Generate adjacent page from same PTE for odd TLB page */
            lsb = (1 << w) >> 6;
            *pw_entrylo0 = entry & ~lsb; /* even page */
            *pw_entrylo1 = entry | lsb; /* odd page */
        } else if (dph) {
            int oddpagebit = 1 << leaf_shift;
            uint64_t vaddr2 = *vaddr ^ oddpagebit;
            if (*vaddr & oddpagebit) {
                *pw_entrylo1 = entry;
            } else {
                *pw_entrylo0 = entry;
            }
            if (get_physical_address(env, &paddr, &prot, vaddr2, MMU_DATA_LOAD,
                                     ACCESS_INT, cpu_mmu_index(env, false)) !=
                                     TLBRET_MATCH) {
                return 0;
            }
            if (!get_pte(env, vaddr2, leafentry_size, &entry)) {
                return 0;
            }
            entry = get_tlb_entry_layout(env, entry, leafentry_size, pf_ptew);
            if (*vaddr & oddpagebit) {
                *pw_entrylo0 = entry;
            } else {
                *pw_entrylo1 = entry;
            }
        } else {
            return 0;
        }
        return 1;
    } else {
        *vaddr = entry;
        return 2;
    }
}